

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<std::vector<TestPreset>_> * __thiscall
cmJSONHelperBuilder::
Vector<cmCMakePresetsGraph::TestPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset>>
          (cmJSONHelper<std::vector<TestPreset>_> *__return_storage_ptr__,cmJSONHelperBuilder *this,
          ErrorGenerator *error,Object<cmCMakePresetsGraph::TestPreset> *func)

{
  Object<cmCMakePresetsGraph::TestPreset> local_68;
  ErrorGenerator *local_20;
  Object<cmCMakePresetsGraph::TestPreset> *func_local;
  ErrorGenerator *error_local;
  
  local_20 = error;
  func_local = (Object<cmCMakePresetsGraph::TestPreset> *)this;
  error_local = (ErrorGenerator *)__return_storage_ptr__;
  Object<cmCMakePresetsGraph::TestPreset>::Object
            (&local_68,(Object<cmCMakePresetsGraph::TestPreset> *)error);
  VectorFilter<cmCMakePresetsGraph::TestPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset>,cmJSONHelperBuilder::Vector<cmCMakePresetsGraph::TestPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset>>(std::function<void(Json::Value_const*,cmJSONState*)>,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset>)::_lambda(cmCMakePresetsGraph::TestPreset_const&)_1_>
            (__return_storage_ptr__,this,&local_68);
  Object<cmCMakePresetsGraph::TestPreset>::~Object(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::vector<T>> Vector(JsonErrors::ErrorGenerator error,
                                             F func)
  {
    return VectorFilter<T, F>(std::move(error), func,
                              [](const T&) { return true; });
  }